

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netbase.cpp
# Opt level: O0

CService * MaybeFlipIPv6toCJDNS(CService *service)

{
  long lVar1;
  bool bVar2;
  undefined8 in_RSI;
  CService *in_RDI;
  long in_FS_OFFSET;
  CService *ret;
  CNetAddr *in_stack_ffffffffffffffa8;
  CService *in_stack_ffffffffffffffb0;
  undefined6 in_stack_ffffffffffffffb8;
  undefined1 in_stack_ffffffffffffffbe;
  undefined1 in_stack_ffffffffffffffbf;
  undefined7 in_stack_ffffffffffffffe0;
  undefined1 uVar3;
  Network net;
  
  net = (Network)((ulong)in_RSI >> 0x20);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar3 = 0;
  CService::CService((CService *)
                     CONCAT17(in_stack_ffffffffffffffbf,
                              CONCAT16(in_stack_ffffffffffffffbe,in_stack_ffffffffffffffb8)),
                     in_stack_ffffffffffffffb0);
  bVar2 = CNetAddr::IsIPv6(in_stack_ffffffffffffffa8);
  if (((bVar2) && (bVar2 = CNetAddr::HasCJDNSPrefix(in_stack_ffffffffffffffa8), bVar2)) &&
     (bVar2 = ReachableNets::Contains
                        ((ReachableNets *)CONCAT17(uVar3,in_stack_ffffffffffffffe0),net), bVar2)) {
    (in_RDI->super_CNetAddr).m_net = NET_CJDNS;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

CService MaybeFlipIPv6toCJDNS(const CService& service)
{
    CService ret{service};
    if (ret.IsIPv6() && ret.HasCJDNSPrefix() && g_reachable_nets.Contains(NET_CJDNS)) {
        ret.m_net = NET_CJDNS;
    }
    return ret;
}